

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::heaptype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  ParseDeclsCtx *pPVar1;
  bool bVar2;
  Ok *u;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_148;
  Err *local_128;
  Err *err;
  undefined1 local_110 [8];
  Result<wasm::WATParser::Ok> _val;
  Result<wasm::WATParser::Ok> type;
  Ok local_a1;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  Ok local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  Ok local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  Ok local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Ok local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  Ok local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseDeclsCtx *local_18;
  ParseDeclsCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  local_28 = sv("func",4);
  bVar2 = ParseInput::takeKeyword(&ctx->in,local_28);
  pPVar1 = local_18;
  if (bVar2) {
    NullTypeParserCtx::makeFunc((NullTypeParserCtx *)local_18);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_29);
  }
  else {
    local_40 = sv("any",3);
    bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_40);
    pPVar1 = local_18;
    if (bVar2) {
      NullTypeParserCtx::makeAny((NullTypeParserCtx *)local_18);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_41);
    }
    else {
      local_58 = sv("extern",6);
      bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_58);
      pPVar1 = local_18;
      if (bVar2) {
        NullTypeParserCtx::makeExtern((NullTypeParserCtx *)local_18);
        Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_59);
      }
      else {
        local_70 = sv("eq",2);
        bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_70);
        pPVar1 = local_18;
        if (bVar2) {
          NullTypeParserCtx::makeEq((NullTypeParserCtx *)local_18);
          Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_71)
          ;
        }
        else {
          local_88 = sv("i31",3);
          bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_88);
          pPVar1 = local_18;
          if (bVar2) {
            NullTypeParserCtx::makeI31((NullTypeParserCtx *)local_18);
            Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>
                      (__return_storage_ptr__,&local_89);
          }
          else {
            local_a0 = sv("struct",6);
            bVar2 = ParseInput::takeKeyword(&pPVar1->in,local_a0);
            pPVar1 = local_18;
            if (bVar2) {
              NullTypeParserCtx::makeStructType((NullTypeParserCtx *)local_18);
              Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>
                        (__return_storage_ptr__,&local_a1);
            }
            else {
              expected = sv("array",5);
              bVar2 = ParseInput::takeKeyword(&pPVar1->in,expected);
              if (bVar2) {
                NullTypeParserCtx::makeArrayType((NullTypeParserCtx *)local_18);
                Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>
                          (__return_storage_ptr__,
                           (Ok *)((long)&type.val.
                                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 + 0x27));
              }
              else {
                __return_storage_ptr___00 =
                     (__index_type *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                             .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                     0x20);
                typeidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                          ((Result<wasm::WATParser::Ok> *)__return_storage_ptr___00,local_18);
                Result<wasm::WATParser::Ok>::Result
                          ((Result<wasm::WATParser::Ok> *)local_110,
                           (Result<wasm::WATParser::Ok> *)__return_storage_ptr___00);
                local_128 = Result<wasm::WATParser::Ok>::getErr
                                      ((Result<wasm::WATParser::Ok> *)local_110);
                bVar2 = local_128 == (Err *)0x0;
                if (!bVar2) {
                  WATParser::Err::Err(&local_148,local_128);
                  Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_148);
                  WATParser::Err::~Err(&local_148);
                }
                Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)local_110);
                if (bVar2) {
                  u = Result<wasm::WATParser::Ok>::operator*
                                ((Result<wasm::WATParser::Ok> *)
                                 ((long)&_val.val.
                                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 + 0x20));
                  Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok&>
                            (__return_storage_ptr__,u);
                }
                Result<wasm::WATParser::Ok>::~Result
                          ((Result<wasm::WATParser::Ok> *)
                           ((long)&_val.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           + 0x20));
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFunc();
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAny();
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExtern();
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEq();
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31();
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType();
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType();
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return *type;
}